

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

void __thiscall
chaiscript::parser::ChaiScript_Parser::build_match<chaiscript::eval::Fun_Call_AST_Node>
          (ChaiScript_Parser *this,size_t t_match_start,string *t_text)

{
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *this_00;
  long in_RDI;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  new_children;
  Parse_Location filepos;
  bool is_deep;
  value_type *in_stack_fffffffffffffed8;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *in_stack_fffffffffffffef0;
  anon_class_24_3_3a5bb1e9 *in_stack_ffffffffffffff48;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *in_stack_ffffffffffffff78;
  Parse_Location *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  
  build_match<chaiscript::eval::Fun_Call_AST_Node>::anon_class_24_3_3a5bb1e9::operator()
            (in_stack_ffffffffffffff48);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)0x2377e3);
  this_00 = (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             *)(in_RDI + 0x70);
  make_shared<chaiscript::AST_Node,chaiscript::eval::Fun_Call_AST_Node,std::__cxx11::string,chaiscript::Parse_Location,std::vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::push_back(this_00,in_stack_fffffffffffffed8);
  std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x237981);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(in_stack_fffffffffffffef0);
  Parse_Location::~Parse_Location((Parse_Location *)0x23799b);
  return;
}

Assistant:

void build_match(size_t t_match_start, std::string t_text = "") {
        bool is_deep = false;

        Parse_Location filepos = [&]()->Parse_Location{ 
          //so we want to take everything to the right of this and make them children
          if (t_match_start != m_match_stack.size()) {
            is_deep = true;
            return Parse_Location(
                m_filename,
                m_match_stack[t_match_start]->location.start.line,
                m_match_stack[t_match_start]->location.start.column,
                m_position.line,
                m_position.col 
              );
          } else {
            return Parse_Location(
                m_filename,
                m_position.line,
                m_position.col,
                m_position.line,
                m_position.col
              );
          }
        }();

        std::vector<AST_NodePtr> new_children;

        if (is_deep) {
          new_children.assign(std::make_move_iterator(m_match_stack.begin() + static_cast<int>(t_match_start)), 
                              std::make_move_iterator(m_match_stack.end()));
          m_match_stack.erase(m_match_stack.begin() + static_cast<int>(t_match_start), m_match_stack.end());
        }

        /// \todo fix the fact that a successful match that captured no ast_nodes doesn't have any real start position
        m_match_stack.push_back(
            chaiscript::make_shared<chaiscript::AST_Node, NodeType>(
              std::move(t_text),
              std::move(filepos),
              std::move(new_children)));
      }